

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_decoder.cc
# Opt level: O0

StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> * __thiscall
draco::StlDecoder::DecodeFromFile(StlDecoder *this,string *file_name)

{
  undefined1 uVar1;
  DecoderBuffer *this_00;
  StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *in_RDI;
  DecoderBuffer buffer;
  vector<char,_std::allocator<char>_> data;
  Status *in_stack_fffffffffffffef8;
  vector<char,_std::allocator<char>_> *this_01;
  DecoderBuffer *in_stack_ffffffffffffff00;
  StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *file_name_00;
  undefined7 in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  allocator<char> local_89;
  string local_88 [88];
  vector<char,_std::allocator<char>_> local_30 [2];
  
  file_name_00 = in_RDI;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x1484fb);
  uVar1 = ReadFileToBuffer((string *)file_name_00,(vector<char,_std::allocator<char>_> *)in_RDI);
  if ((bool)uVar1) {
    DecoderBuffer::DecoderBuffer(in_stack_ffffffffffffff00);
    this_01 = local_30;
    this_00 = (DecoderBuffer *)
              std::vector<char,_std::allocator<char>_>::data
                        ((vector<char,_std::allocator<char>_> *)0x14864b);
    std::vector<char,_std::allocator<char>_>::size(this_01);
    DecoderBuffer::Init(this_00,(char *)this_01,0x14866b);
    DecodeFromBuffer((StlDecoder *)
                     data.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_,
                     (DecoderBuffer *)
                     data.super__Vector_base<char,_std::allocator<char>_>._M_impl._8_8_);
    DecoderBuffer::~DecoderBuffer((DecoderBuffer *)0x148695);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               (allocator<char> *)CONCAT17(uVar1,in_stack_ffffffffffffff30));
    Status::Status((Status *)in_stack_ffffffffffffff00,
                   (Code)((ulong)in_stack_fffffffffffffef8 >> 0x20),(string *)0x148565);
    StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::StatusOr
              ((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)
               in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    Status::~Status((Status *)0x148588);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator(&local_89);
  }
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)in_RDI);
  return file_name_00;
}

Assistant:

StatusOr<std::unique_ptr<Mesh>> StlDecoder::DecodeFromFile(
    const std::string &file_name) {
  std::vector<char> data;
  if (!ReadFileToBuffer(file_name, &data)) {
    return Status(Status::IO_ERROR, "Unable to read input file.");
  }
  DecoderBuffer buffer;
  buffer.Init(data.data(), data.size());
  return DecodeFromBuffer(&buffer);
}